

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  char *in_RCX;
  char *pcVar6;
  ulong uVar7;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int family_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int sock_05;
  int sock_06;
  int sock_07;
  int family_01;
  int sock_08;
  int family_02;
  int sock_09;
  int family_03;
  int sock_10;
  int sock_11;
  int sock_12;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  int sock_17;
  FILE *__stream;
  undefined8 uStack_40;
  size_t sz;
  char buf [8];
  
  iVar1 = test_socket_impl((char *)0x28,0x20,in_EDX,(int)in_RCX);
  test_bind_impl((char *)0x29,iVar1,sock,in_RCX);
  iVar2 = test_socket_impl((char *)0x2a,0x21,family,(int)in_RCX);
  iVar3 = nn_setsockopt(iVar2,0x21,1,"",0);
  if (iVar3 == 0) {
    pcVar6 = buf;
    iVar3 = nn_getsockopt(iVar2,0x21,1);
    if (iVar3 == -1) {
      iVar3 = nn_errno();
      if (iVar3 == 0x5c) {
        test_connect_impl((char *)0x30,iVar2,sock_00,pcVar6);
        iVar3 = test_socket_impl((char *)0x31,0x21,family_00,(int)pcVar6);
        pcVar6 = "";
        iVar4 = nn_setsockopt(iVar3,0x21,1,"",0);
        if (iVar4 == 0) {
          test_connect_impl((char *)0x34,iVar3,sock_01,pcVar6);
          nn_sleep(10);
          test_send_impl((char *)0x39,iVar1,sock_02,pcVar6);
          test_recv_impl((char *)0x3a,iVar2,sock_03,pcVar6);
          test_recv_impl((char *)0x3b,iVar3,sock_04,pcVar6);
          iVar4 = (int)pcVar6;
          test_close_impl((char *)0x3d,iVar1,sock_05);
          test_close_impl((char *)0x3e,iVar2,sock_06);
          test_close_impl((char *)0x3f,iVar3,sock_07);
          iVar1 = test_socket_impl((char *)0x43,0x21,family_01,iVar4);
          pcVar6 = "";
          iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
          if (iVar2 == 0) {
            test_bind_impl((char *)0x46,iVar1,sock_08,pcVar6);
            iVar2 = test_socket_impl((char *)0x47,0x20,family_02,(int)pcVar6);
            test_connect_impl((char *)0x48,iVar2,sock_09,pcVar6);
            iVar3 = test_socket_impl((char *)0x49,0x20,family_03,(int)pcVar6);
            test_connect_impl((char *)0x4a,iVar3,sock_10,pcVar6);
            nn_sleep(100);
            test_send_impl((char *)0x4d,iVar2,sock_11,pcVar6);
            test_send_impl((char *)0x4e,iVar3,sock_12,pcVar6);
            test_recv_impl((char *)0x4f,iVar1,sock_13,pcVar6);
            test_recv_impl((char *)0x50,iVar1,sock_14,pcVar6);
            test_close_impl((char *)0x52,iVar3,sock_15);
            test_close_impl((char *)0x53,iVar2,sock_16);
            test_close_impl((char *)0x54,iVar1,sock_17);
            return 0;
          }
          nn_backtrace_print();
          __stream = _stderr;
          puVar5 = (uint *)__errno_location();
          pcVar6 = nn_err_strerror(*puVar5);
          uVar7 = (ulong)*puVar5;
          uStack_40 = 0x45;
        }
        else {
          nn_backtrace_print();
          __stream = _stderr;
          puVar5 = (uint *)__errno_location();
          pcVar6 = nn_err_strerror(*puVar5);
          uVar7 = (ulong)*puVar5;
          uStack_40 = 0x33;
        }
        goto LAB_00101629;
      }
    }
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == ENOPROTOOPT",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            0x2f);
  }
  else {
    nn_backtrace_print();
    __stream = _stderr;
    puVar5 = (uint *)__errno_location();
    pcVar6 = nn_err_strerror(*puVar5);
    uVar7 = (ulong)*puVar5;
    uStack_40 = 0x2c;
LAB_00101629:
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar6,uVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            uStack_40);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int pub1;
    int pub2;
    int sub1;
    int sub2;
    char buf [8];
    size_t sz;

    pub1 = test_socket (AF_SP, NN_PUB);
    test_bind (pub1, SOCKET_ADDRESS);
    sub1 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    sz = sizeof (buf);
    rc = nn_getsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, buf, &sz);
    nn_assert (rc == -1 && nn_errno () == ENOPROTOOPT);
    test_connect (sub1, SOCKET_ADDRESS);
    sub2 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub2, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    test_connect (sub2, SOCKET_ADDRESS);

    /*  Wait till connections are established to prevent message loss. */
    nn_sleep (10);

    test_send (pub1, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");
    test_recv (sub2, "0123456789012345678901234567890123456789");

    test_close (pub1);
    test_close (sub1);
    test_close (sub2);

    /*  Check receiving messages from two publishers. */

    sub1 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    test_bind (sub1, SOCKET_ADDRESS);
    pub1 = test_socket (AF_SP, NN_PUB);
    test_connect (pub1, SOCKET_ADDRESS);
    pub2 = test_socket (AF_SP, NN_PUB);
    test_connect (pub2, SOCKET_ADDRESS);
    nn_sleep (100);

    test_send (pub1, "0123456789012345678901234567890123456789");
    test_send (pub2, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");

    test_close (pub2);
    test_close (pub1);
    test_close (sub1);

    return 0;
}